

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O1

REF_STATUS ref_gather_plt_tet_zone(REF_GRID ref_grid,REF_INT ldim,REF_DBL *scalar,FILE *file)

{
  double dVar1;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  double *pdVar6;
  int iVar7;
  long lVar8;
  undefined4 in_register_00000034;
  long lVar9;
  double *pdVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double maxdata;
  double mindata;
  double tempdata;
  REF_GLOB *l2c;
  int dataformat;
  int connsharing;
  int varsharing;
  int passive;
  float zonemarker;
  REF_GLOB nnode;
  REF_LONG ncell;
  double local_a0;
  double local_98;
  double local_90;
  REF_GLOB *local_88;
  int local_7c;
  double *local_78;
  ulong local_70;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  REF_CELL local_58;
  long local_50;
  long local_48;
  ulong local_40;
  double *local_38;
  
  local_70 = CONCAT44(in_register_00000034,ldim);
  ref_mpi = ref_grid->mpi;
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[8];
  local_5c = 0x43958000;
  local_7c = 2;
  local_60 = 0;
  local_64 = 0;
  local_68 = 0xffffffff;
  if (1 < ref_mpi->timing) {
    ref_mpi_stopwatch_stop(ref_mpi,"plt tet start");
  }
  uVar2 = ref_grid_compact_cell_nodes(ref_grid,ref_cell,&local_50,&local_48,&local_88);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xff0,
           "ref_gather_plt_tet_zone",(ulong)uVar2,"l2c");
    return uVar2;
  }
  if ((0 < local_50) && (0 < local_48)) {
    local_78 = scalar;
    if (1 < ref_mpi->timing) {
      ref_mpi_stopwatch_stop(ref_mpi,"plt tet compact");
    }
    local_58 = ref_cell;
    if (ref_mpi->id == 0) {
      sVar3 = fwrite(&local_5c,4,1,(FILE *)file);
      if (sVar3 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xff9,"ref_gather_plt_tet_zone","zonemarker",1,sVar3);
        return 1;
      }
      if (-3 < (int)local_70) {
        iVar7 = (int)local_70 + 2;
        if (iVar7 < 1) {
          iVar7 = 0;
        }
        iVar7 = iVar7 + 1;
        do {
          sVar3 = fwrite(&local_7c,4,1,(FILE *)file);
          if (sVar3 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xffc,"ref_gather_plt_tet_zone","int",1,sVar3);
            return 1;
          }
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      sVar3 = fwrite(&local_60,4,1,(FILE *)file);
      if (sVar3 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xfff,"ref_gather_plt_tet_zone","int",1,sVar3);
        return 1;
      }
      sVar3 = fwrite(&local_64,4,1,(FILE *)file);
      if (sVar3 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x1000,"ref_gather_plt_tet_zone","int",1,sVar3);
        return 1;
      }
      sVar3 = fwrite(&local_68,4,1,(FILE *)file);
      if (sVar3 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x1001,"ref_gather_plt_tet_zone","int",1,sVar3);
        return 1;
      }
    }
    lVar11 = 0;
    lVar8 = 0;
    do {
      local_98 = 1e+200;
      local_a0 = -1e+200;
      if (0 < (long)ref_node->max) {
        dVar13 = -1e+200;
        dVar14 = 1e+200;
        lVar9 = 0;
        lVar5 = lVar11;
        do {
          if ((local_88[lVar9] != -1) && (ref_node->ref_mpi->id == ref_node->part[lVar9])) {
            dVar1 = *(double *)((long)ref_node->real + lVar5);
            if (dVar1 <= dVar14) {
              dVar14 = dVar1;
            }
            dVar1 = *(double *)((long)ref_node->real + lVar5);
            local_a0 = dVar13;
            local_98 = dVar14;
            if (dVar13 <= dVar1) {
              dVar13 = dVar1;
              local_a0 = dVar1;
            }
          }
          lVar9 = lVar9 + 1;
          lVar5 = lVar5 + 0x78;
        } while (ref_node->max != lVar9);
      }
      local_90 = local_98;
      uVar2 = ref_mpi_min(ref_mpi,&local_90,&local_98,3);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x100e,"ref_gather_plt_tet_zone",(ulong)uVar2,"mpi min");
        return uVar2;
      }
      local_90 = local_a0;
      uVar2 = ref_mpi_max(ref_mpi,&local_90,&local_a0,3);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x1010,"ref_gather_plt_tet_zone",(ulong)uVar2,"mpi max");
        return uVar2;
      }
      if (ref_mpi->id == 0) {
        sVar3 = fwrite(&local_98,8,1,(FILE *)file);
        if (sVar3 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x1012,"ref_gather_plt_tet_zone","mindata",1,sVar3);
          return 1;
        }
        sVar3 = fwrite(&local_a0,8,1,(FILE *)file);
        if (sVar3 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x1013,"ref_gather_plt_tet_zone","maxdata",1,sVar3);
          return 1;
        }
      }
      lVar8 = lVar8 + 1;
      lVar11 = lVar11 + 8;
    } while (lVar8 != 3);
    if (0 < (int)local_70) {
      uVar4 = local_70 & 0xffffffff;
      uVar12 = 0;
      pdVar10 = local_78;
      local_40 = uVar4;
      do {
        local_98 = 1e+200;
        local_a0 = -1e+200;
        if (0 < (long)ref_node->max) {
          dVar13 = -1e+200;
          dVar14 = 1e+200;
          lVar8 = 0;
          pdVar6 = pdVar10;
          do {
            if ((local_88[lVar8] != -1) && (ref_node->ref_mpi->id == ref_node->part[lVar8])) {
              dVar1 = *pdVar6;
              if (dVar1 <= dVar14) {
                dVar14 = dVar1;
              }
              local_a0 = dVar13;
              local_98 = dVar14;
              if (dVar13 <= dVar1) {
                dVar13 = dVar1;
                local_a0 = dVar1;
              }
            }
            lVar8 = lVar8 + 1;
            pdVar6 = pdVar6 + uVar4;
          } while (ref_node->max != lVar8);
        }
        local_90 = local_98;
        local_38 = pdVar10;
        uVar2 = ref_mpi_min(ref_mpi,&local_90,&local_98,3);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x1020,"ref_gather_plt_tet_zone",(ulong)uVar2,"mpi min");
          return uVar2;
        }
        local_90 = local_a0;
        uVar2 = ref_mpi_max(ref_mpi,&local_90,&local_a0,3);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x1022,"ref_gather_plt_tet_zone",(ulong)uVar2,"mpi max");
          return uVar2;
        }
        if (ref_mpi->id == 0) {
          sVar3 = fwrite(&local_98,8,1,(FILE *)file);
          if (sVar3 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x1024,"ref_gather_plt_tet_zone","mindata",1,sVar3);
            return 1;
          }
          sVar3 = fwrite(&local_a0,8,1,(FILE *)file);
          if (sVar3 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x1025,"ref_gather_plt_tet_zone","maxdata",1,sVar3);
            return 1;
          }
        }
        uVar12 = uVar12 + 1;
        pdVar10 = local_38 + 1;
      } while (uVar12 != local_40);
    }
    pdVar10 = local_78;
    if (1 < ref_mpi->timing) {
      ref_mpi_stopwatch_stop(ref_mpi,"plt tet min/max");
    }
    uVar2 = ref_gather_node_tec_block
                      (ref_node,local_50,local_88,(REF_INT)local_70,pdVar10,local_7c,file);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x102d,"ref_gather_plt_tet_zone",(ulong)uVar2,"block points");
      return uVar2;
    }
    if (1 < ref_mpi->timing) {
      ref_mpi_stopwatch_stop(ref_mpi,"plt tet node");
    }
    uVar2 = ref_gather_cell_tec(ref_node,local_58,local_48,local_88,1,file);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x1032,"ref_gather_plt_tet_zone",(ulong)uVar2,"c2n");
      return uVar2;
    }
    if (1 < ref_mpi->timing) {
      ref_mpi_stopwatch_stop(ref_mpi,"plt tet cell");
    }
  }
  if (local_88 != (REF_GLOB *)0x0) {
    free(local_88);
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_plt_tet_zone(REF_GRID ref_grid,
                                                  REF_INT ldim, REF_DBL *scalar,
                                                  FILE *file) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  float zonemarker = 299.0;
  REF_LONG ncell;
  REF_GLOB nnode, *l2c;
  int dataformat = 2; /*1=Float, 2=Double*/
  int passive = 0;
  int varsharing = 0;
  int connsharing = -1;
  double mindata, maxdata, tempdata;
  REF_INT node, ixyz, i;

  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "plt tet start");

  RSS(ref_grid_compact_cell_nodes(ref_grid, ref_cell, &nnode, &ncell, &l2c),
      "l2c");
  if (nnode <= 0 || ncell <= 0) {
    ref_free(l2c);
    return REF_SUCCESS;
  }
  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "plt tet compact");

  if (ref_mpi_once(ref_mpi)) {
    REIS(1, fwrite(&zonemarker, sizeof(float), 1, file), "zonemarker");

    for (i = 0; i < 3 + ldim; i++) {
      REIS(1, fwrite(&dataformat, sizeof(int), 1, file), "int");
    }

    REIS(1, fwrite(&passive, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&varsharing, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&connsharing, sizeof(int), 1, file), "int");
  }

  for (ixyz = 0; ixyz < 3; ixyz++) {
    mindata = REF_DBL_MAX;
    maxdata = REF_DBL_MIN;
    for (node = 0; node < ref_node_max(ref_node); node++) {
      if (REF_EMPTY != l2c[node] && ref_node_owned(ref_node, node)) {
        mindata = MIN(mindata, ref_node_xyz(ref_node, ixyz, node));
        maxdata = MAX(maxdata, ref_node_xyz(ref_node, ixyz, node));
      }
    }
    tempdata = mindata;
    RSS(ref_mpi_min(ref_mpi, &tempdata, &mindata, REF_DBL_TYPE), "mpi min");
    tempdata = maxdata;
    RSS(ref_mpi_max(ref_mpi, &tempdata, &maxdata, REF_DBL_TYPE), "mpi max");
    if (ref_mpi_once(ref_mpi)) {
      REIS(1, fwrite(&mindata, sizeof(double), 1, file), "mindata");
      REIS(1, fwrite(&maxdata, sizeof(double), 1, file), "maxdata");
    }
  }
  for (i = 0; i < ldim; i++) {
    mindata = REF_DBL_MAX;
    maxdata = REF_DBL_MIN;
    for (node = 0; node < ref_node_max(ref_node); node++) {
      if (REF_EMPTY != l2c[node] && ref_node_owned(ref_node, node)) {
        mindata = MIN(mindata, scalar[i + ldim * node]);
        maxdata = MAX(maxdata, scalar[i + ldim * node]);
      }
    }
    tempdata = mindata;
    RSS(ref_mpi_min(ref_mpi, &tempdata, &mindata, REF_DBL_TYPE), "mpi min");
    tempdata = maxdata;
    RSS(ref_mpi_max(ref_mpi, &tempdata, &maxdata, REF_DBL_TYPE), "mpi max");
    if (ref_mpi_once(ref_mpi)) {
      REIS(1, fwrite(&mindata, sizeof(double), 1, file), "mindata");
      REIS(1, fwrite(&maxdata, sizeof(double), 1, file), "maxdata");
    }
  }
  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "plt tet min/max");

  RSS(ref_gather_node_tec_block(ref_node, nnode, l2c, ldim, scalar, dataformat,
                                file),
      "block points");
  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "plt tet node");

  RSS(ref_gather_cell_tec(ref_node, ref_cell, ncell, l2c, REF_TRUE, file),
      "c2n");
  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "plt tet cell");

  ref_free(l2c);
  return REF_SUCCESS;
}